

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_depspawn_sync.cpp
# Opt level: O0

void h(int *i,bool *test_ok)

{
  ostream *poVar1;
  ostream *this;
  byte *in_RSI;
  int *in_RDI;
  rep_conflict rVar2;
  Observer *in_stack_00000010;
  scoped_lock l_1;
  Observer __depspawn_temporary72;
  scoped_lock l;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  Observer *in_stack_ffffffffffffff20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff28;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff30;
  bool local_a9;
  duration<double,_std::ratio<1L,_1L>_> local_68 [5];
  undefined8 local_40;
  rep local_38;
  duration<double,_std::ratio<1L,_1L>_> local_30 [4];
  byte *local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff20,
             (spin_mutex_t *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  poVar1 = std::operator<<((ostream *)&std::cerr,"h begin: ");
  local_40 = std::chrono::_V2::system_clock::now();
  local_38 = (rep)std::chrono::operator-
                            (in_stack_ffffffffffffff28,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_ffffffffffffff20);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  this = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x121f00);
  *local_8 = 0;
  depspawn::Observer::Observer(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
  depspawn::spawn<void(int&),int&>((_func_void_int_ptr *)poVar1,(int *)this);
  depspawn::spawn<void(int&),int&>((_func_void_int_ptr *)poVar1,(int *)this);
  depspawn::spawn<void(int&),int&>((_func_void_int_ptr *)poVar1,(int *)this);
  depspawn::Observer::~Observer(in_stack_00000010);
  local_a9 = false;
  if ((*local_10 & 1) != 0) {
    local_a9 = *local_8 == 0xc;
  }
  *local_10 = local_a9;
  poVar1 = std::operator<<((ostream *)&std::cout,"x = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff20,
             (spin_mutex_t *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  poVar1 = std::operator<<((ostream *)&std::cerr,"h finish: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            (in_stack_ffffffffffffff28,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffff20);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_68);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1220c2);
  return;
}

Assistant:

void h(int &i, bool& test_ok) {
  LOG("h begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i = 0;
  
  depspawn_sync(
    spawn(g, i); //Sets x to 1
    spawn(g, i); //Sets x to 2
    spawn(f, i); //Sets x to 12
  )
  
  test_ok = test_ok && (i == 12);
  std::cout << "x = " << x << std::endl;
  
  LOG("h finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}